

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void __thiscall ON_RTreeMemPool::DeallocateAll(ON_RTreeMemPool *this)

{
  Blk *pBVar1;
  Blk *next;
  Blk *p;
  ON_RTreeMemPool *this_local;
  
  next = this->m_blk_list;
  if (next != (Blk *)0x0) {
    this->m_nodes = (Blk *)0x0;
    this->m_list_nodes = (Blk *)0x0;
    this->m_buffer = (uchar *)0x0;
    this->m_buffer_capacity = 0;
    this->m_blk_list = (Blk *)0x0;
    this->m_sizeof_blk = 0;
    this->m_sizeof_heap = 0;
    while (next != (Blk *)0x0) {
      pBVar1 = next->m_next;
      onfree(next);
      next = pBVar1;
    }
  }
  return;
}

Assistant:

void ON_RTreeMemPool::DeallocateAll()
{
  struct Blk* p = m_blk_list;

  if (nullptr != p)
  {
    m_nodes = nullptr;
    m_list_nodes = nullptr;
    m_buffer = nullptr;
    m_buffer_capacity = 0;
    m_blk_list = nullptr;
    m_sizeof_blk = 0;
    m_sizeof_heap = 0;
    while (p)
    {
      struct Blk* next = p->m_next;
      onfree(p);
      p = next;
    }
  }
}